

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  ulong uVar1;
  ModelDescription *this_00;
  Metadata *pMVar2;
  undefined8 *puVar3;
  
  Model(this);
  this_00 = Specification::Model::_internal_mutable_description
                      ((this->m_spec).
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  pMVar2 = Specification::ModelDescription::_internal_mutable_metadata(this_00);
  uVar1 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&pMVar2->shortdescription_,description,puVar3);
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }